

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

void __thiscall
apngasm::APNGAsm::get_rect
          (APNGAsm *this,uint w,uint h,uchar *pimage1,uchar *pimage2,uchar *ptemp,uchar coltype,
          uint bpp,uint stride,int zbuf_size,uint has_tcolor,uint tcolor,int n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uchar *puVar5;
  ushort uVar6;
  int iVar7;
  byte bVar8;
  int w_00;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uchar *puVar12;
  uint x;
  uint uVar13;
  long lVar14;
  uint y;
  bool bVar15;
  
  bVar15 = has_tcolor != 0;
  iVar7 = 1;
  if (bpp - 1 < 4) {
    x = w - 1;
    y = h - 1;
    switch(bpp) {
    case 1:
      uVar2 = 0;
      uVar13 = 0;
      iVar7 = 0;
      puVar5 = pimage2;
      puVar12 = ptemp;
      for (uVar11 = 0; uVar11 != h; uVar11 = uVar11 + 1) {
        for (lVar4 = 0; uVar3 = (uint)lVar4, w != uVar3; lVar4 = lVar4 + 1) {
          bVar8 = puVar5[lVar4];
          if (pimage1[lVar4] == bVar8) {
            bVar8 = (byte)tcolor;
          }
          else {
            bVar1 = bVar15;
            if (bVar8 == tcolor) {
              bVar1 = false;
            }
            if (coltype != '\0') {
              bVar1 = bVar15;
            }
            if (has_tcolor == 0) {
              bVar1 = bVar15;
            }
            if ((coltype == '\x03') && (this->_trns[bVar8] != 0xff)) {
              bVar1 = false;
            }
            iVar7 = iVar7 + 1;
            if (uVar3 < x) {
              x = uVar3;
            }
            if (uVar2 < uVar3) {
              uVar2 = uVar3;
            }
            if (uVar11 < y) {
              y = uVar11;
            }
            bVar15 = bVar1;
            if (uVar13 < uVar11) {
              uVar13 = uVar11;
            }
          }
          puVar12[lVar4] = bVar8;
        }
        pimage1 = pimage1 + w;
        puVar5 = puVar5 + lVar4;
        puVar12 = puVar12 + lVar4;
      }
      break;
    case 2:
      uVar2 = 0;
      uVar13 = 0;
      iVar7 = 0;
      puVar5 = pimage2;
      puVar12 = ptemp;
      for (uVar11 = 0; uVar11 != h; uVar11 = uVar11 + 1) {
        lVar4 = 0;
        for (lVar14 = 0; uVar3 = (uint)lVar14, w != uVar3; lVar14 = lVar14 + 1) {
          uVar6 = *(ushort *)(puVar5 + lVar14 * 2);
          if ((*(ushort *)(pimage1 + lVar14 * 2) == uVar6) ||
             ((uVar6 | *(ushort *)(pimage1 + lVar14 * 2)) < 0x100)) {
            uVar6 = 0;
          }
          else {
            iVar7 = iVar7 + 1;
            if (uVar6 < 0xff00) {
              bVar15 = false;
            }
            if (uVar3 < x) {
              x = uVar3;
            }
            if (uVar2 < uVar3) {
              uVar2 = uVar3;
            }
            if (uVar11 < y) {
              y = uVar11;
            }
            if (uVar13 < uVar11) {
              uVar13 = uVar11;
            }
          }
          *(ushort *)(puVar12 + lVar14 * 2) = uVar6;
          lVar4 = lVar4 + -2;
        }
        pimage1 = pimage1 + (ulong)w * 2;
        puVar5 = puVar5 + -lVar4;
        puVar12 = puVar12 + -lVar4;
      }
      break;
    case 3:
      uVar2 = 0;
      uVar13 = 0;
      iVar7 = 0;
      puVar5 = pimage2;
      puVar12 = ptemp;
      for (uVar11 = 0; uVar11 != h; uVar11 = uVar11 + 1) {
        lVar4 = 0;
        for (uVar3 = 0; w != uVar3; uVar3 = uVar3 + 1) {
          uVar10 = (uint)CONCAT21(*(undefined2 *)(puVar5 + lVar4 + 1),puVar5[lVar4]);
          uVar9 = tcolor;
          if (CONCAT21(*(undefined2 *)(pimage1 + lVar4 + 1),pimage1[lVar4]) != uVar10) {
            iVar7 = iVar7 + 1;
            bVar1 = bVar15;
            if (uVar10 == tcolor) {
              bVar1 = false;
            }
            if (has_tcolor != 0) {
              bVar15 = bVar1;
            }
            if (uVar3 < x) {
              x = uVar3;
            }
            if (uVar2 < uVar3) {
              uVar2 = uVar3;
            }
            if (uVar11 < y) {
              y = uVar11;
            }
            uVar9 = uVar10;
            if (uVar13 < uVar11) {
              uVar13 = uVar11;
            }
          }
          *(short *)(puVar12 + lVar4) = (short)uVar9;
          puVar12[lVar4 + 2] = (uchar)(uVar9 >> 0x10);
          lVar4 = lVar4 + 3;
        }
        pimage1 = pimage1 + (ulong)w * 3;
        puVar5 = puVar5 + lVar4;
        puVar12 = puVar12 + lVar4;
      }
      break;
    case 4:
      uVar2 = 0;
      uVar13 = 0;
      iVar7 = 0;
      puVar5 = ptemp;
      puVar12 = pimage2;
      for (uVar11 = 0; uVar11 != h; uVar11 = uVar11 + 1) {
        lVar4 = 0;
        for (lVar14 = 0; uVar3 = (uint)lVar14, w != uVar3; lVar14 = lVar14 + 1) {
          uVar9 = *(uint *)(puVar12 + lVar14 * 4);
          if ((*(uint *)(pimage1 + lVar14 * 4) == uVar9) ||
             ((*(uint *)(pimage1 + lVar14 * 4) | uVar9) < 0x1000000)) {
            uVar9 = 0;
          }
          else {
            iVar7 = iVar7 + 1;
            if (uVar9 < 0xff000000) {
              bVar15 = false;
            }
            if (uVar3 < x) {
              x = uVar3;
            }
            if (uVar2 < uVar3) {
              uVar2 = uVar3;
            }
            if (uVar11 < y) {
              y = uVar11;
            }
            if (uVar13 < uVar11) {
              uVar13 = uVar11;
            }
          }
          *(uint *)(puVar5 + lVar14 * 4) = uVar9;
          lVar4 = lVar4 + -4;
        }
        pimage1 = pimage1 + (ulong)w * 4;
        puVar12 = puVar12 + -lVar4;
        puVar5 = puVar5 + -lVar4;
      }
    }
    if (iVar7 == 0) {
      y = 0;
      iVar7 = 1;
      x = 0;
      w_00 = iVar7;
    }
    else {
      iVar7 = (uVar13 - y) + 1;
      w_00 = (uVar2 - x) + 1;
    }
  }
  else {
    y = 0;
    x = 0;
    w_00 = iVar7;
  }
  deflate_rect_op(this,pimage2,x,y,w_00,iVar7,bpp,stride,zbuf_size,n * 2);
  if (bVar15) {
    deflate_rect_op(this,ptemp,x,y,w_00,iVar7,bpp,stride,zbuf_size,n * 2 | 1);
  }
  return;
}

Assistant:

void APNGAsm::get_rect(unsigned int w, unsigned int h, unsigned char *pimage1, unsigned char *pimage2, unsigned char *ptemp, unsigned char coltype, unsigned int bpp, unsigned int stride, int zbuf_size, unsigned int has_tcolor, unsigned int tcolor, int n)
  {
    unsigned int   i, j, x0, y0, w0, h0;
    unsigned int   x_min = w-1;
    unsigned int   y_min = h-1;
    unsigned int   x_max = 0;
    unsigned int   y_max = 0;
    unsigned int   diffnum = 0;
    unsigned int   over_is_possible = 1;

    if (!has_tcolor)
      over_is_possible = 0;

    if (bpp == 1)
    {
      unsigned char *pa = pimage1;
      unsigned char *pb = pimage2;
      unsigned char *pc = ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned char c = *pb++;
        if (*pa++ != c)
        {
          diffnum++;
          if (coltype == 0 && has_tcolor && c == tcolor) over_is_possible = 0;
          if (coltype == 3 && _trns[c] != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c = tcolor;

        *pc++ = c;
      }
    }
    else
    if (bpp == 2)
    {
      unsigned short *pa = (unsigned short *)pimage1;
      unsigned short *pb = (unsigned short *)pimage2;
      unsigned short *pc = (unsigned short *)ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = *pa++;
        unsigned int c2 = *pb++;
        if ((c1 != c2) && ((c1>>8) || (c2>>8)))
        {
          diffnum++;
          if ((c2 >> 8) != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = 0;

        *pc++ = c2;
      }
    }
    else
    if (bpp == 3)
    {
      unsigned char *pa = pimage1;
      unsigned char *pb = pimage2;
      unsigned char *pc = ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = (pa[2]<<16) + (pa[1]<<8) + pa[0];
        unsigned int c2 = (pb[2]<<16) + (pb[1]<<8) + pb[0];
        if (c1 != c2)
        {
          diffnum++;
          if (has_tcolor && c2 == tcolor) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = tcolor;

        memcpy(pc, &c2, 3);
        pa += 3;
        pb += 3;
        pc += 3;
      }
    }
    else
    if (bpp == 4)
    {
      unsigned int *pa = (unsigned int *)pimage1;
      unsigned int *pb = (unsigned int *)pimage2;
      unsigned int *pc = (unsigned int *)ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = *pa++;
        unsigned int c2 = *pb++;
        if ((c1 != c2) && ((c1>>24) || (c2>>24)))
        {
          diffnum++;
          if ((c2 >> 24) != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = 0;

        *pc++ = c2;
      }
    }

    if (diffnum == 0)
    {
      x0 = y0 = 0;
      w0 = h0 = 1;
    }
    else
    {
      x0 = x_min;
      y0 = y_min;
      w0 = x_max-x_min+1;
      h0 = y_max-y_min+1;
    }

    deflate_rect_op(pimage2, x0, y0, w0, h0, bpp, stride, zbuf_size, n*2);

    if (over_is_possible)
      deflate_rect_op(ptemp, x0, y0, w0, h0, bpp, stride, zbuf_size, n*2+1);
  }